

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_NtkCreateNode(Acb_Ntk_t *p,word uTruth,Vec_Int_t *vSupp)

{
  int iVar1;
  int Pivot;
  Vec_Int_t *vSupp_local;
  word uTruth_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Vec_IntSize(vSupp);
  iVar1 = Acb_ObjAlloc(p,ABC_OPER_LUT,iVar1,0);
  Acb_ObjSetTruth(p,iVar1,uTruth);
  Acb_ObjAddFanins(p,iVar1,vSupp);
  Acb_ObjAddFaninFanout(p,iVar1);
  Acb_ObjComputeLevelD(p,iVar1);
  return iVar1;
}

Assistant:

int Acb_NtkCreateNode( Acb_Ntk_t * p, word uTruth, Vec_Int_t * vSupp )
{
    int Pivot = Acb_ObjAlloc( p, ABC_OPER_LUT, Vec_IntSize(vSupp), 0 );
    Acb_ObjSetTruth( p, Pivot, uTruth );
    Acb_ObjAddFanins( p, Pivot, vSupp );
    Acb_ObjAddFaninFanout( p, Pivot );
    Acb_ObjComputeLevelD( p, Pivot );
    return Pivot;
}